

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint ON_SubDSectorType::MinimumSectorFaceCount(ON_SubDVertexTag vertex_tag)

{
  char *sFormat;
  int line_number;
  undefined7 in_register_00000039;
  
  switch(CONCAT71(in_register_00000039,vertex_tag) & 0xffffffff) {
  case 0:
    ON_SubDIncrementErrorCount();
    sFormat = "Unset tag.";
    line_number = 0x1ed;
    break;
  case 1:
  case 4:
    return 2;
  case 2:
  case 3:
    return 1;
  default:
    ON_SubDIncrementErrorCount();
    sFormat = "Invalid tag.";
    line_number = 0x20a;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
             ,line_number,"",sFormat);
  return 0xffffffff;
}

Assistant:

unsigned int ON_SubDSectorType::MinimumSectorFaceCount(
  ON_SubDVertexTag vertex_tag
  )
{
  unsigned int minimum_sector_face_count;
  switch (vertex_tag)
  {
  case ON_SubDVertexTag::Unset:
    ON_SUBD_ERROR("Unset tag.");
    minimum_sector_face_count = ON_UNSET_UINT_INDEX;
    break;

  case ON_SubDVertexTag::Smooth:
    // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Smooth
    // See comments in ON_SubDSectorType::GetSurfaceEvaluationCoefficients()
    // for more details on how this case is handled.
    minimum_sector_face_count = 2; // 3 without special case handling
    break;

  case ON_SubDVertexTag::Crease:
    // A "wire" crease can have zero faces - this is the minimum when faces exist
    minimum_sector_face_count = 1;
    break;

  case ON_SubDVertexTag::Corner:
    // A "wire" corner can have zero faces - this is the minimum when faces exist
    minimum_sector_face_count = 1;
    break;

  case ON_SubDVertexTag::Dart:
    // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Dart
    // See comments in ON_SubDSectorType::GetSurfaceEvaluationCoefficients()
    // for more details on how this case is handled.
    minimum_sector_face_count = 2; // 3 without special case handling
    break;

  default:
    ON_SUBD_ERROR("Invalid tag.");
    minimum_sector_face_count = ON_UNSET_UINT_INDEX;
    break;
  }

  return minimum_sector_face_count;
}